

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_all.cc
# Opt level: O0

void * pem_read_DSAparams_d2i(void **x,uchar **inp,long len)

{
  DSA *pDVar1;
  long len_local;
  uchar **inp_local;
  void **x_local;
  
  pDVar1 = d2i_DSAparams((DSA **)x,inp,len);
  return pDVar1;
}

Assistant:

static EC_KEY *pkey_get_eckey(EVP_PKEY *key, EC_KEY **eckey) {
  EC_KEY *dtmp;
  if (!key) {
    return NULL;
  }
  dtmp = EVP_PKEY_get1_EC_KEY(key);
  EVP_PKEY_free(key);
  if (!dtmp) {
    return NULL;
  }
  if (eckey) {
    EC_KEY_free(*eckey);
    *eckey = dtmp;
  }
  return dtmp;
}